

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall
aggreports::MeanDamageRatio
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          offset_in_OutLosses_to_subr GetOutLoss,int epcalc,int eptype,int eptype_tvar)

{
  bool bVar1;
  reference this_00;
  reference ppVar2;
  mapped_type *this_01;
  undefined4 in_register_0000000c;
  long *plVar3;
  int in_stack_00000008;
  code *local_e0;
  value_type_conflict2 local_b8 [4];
  undefined8 uStack_a8;
  pair<const_outkey2,_OutLosses> x;
  _Self local_88;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  items;
  int eptype_local;
  int epcalc_local;
  offset_in_OutLosses_to_subr GetOutLoss_local;
  vector<int,_std::allocator<int>_> *fileIDs_local;
  aggreports *this_local;
  
  items._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = eptype_tvar;
  items._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = eptype;
  std::
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  ::map((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
         *)&__range1);
  this_00 = std::
            vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
            ::operator[](this->out_loss_,0);
  __end1 = std::
           map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
           ::begin(this_00);
  local_88._M_node =
       (_Base_ptr)
       std::
       map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
       ::end(this_00);
  while (bVar1 = std::operator!=(&__end1,&local_88), bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator*(&__end1);
    x.first.sidx = (int)(ppVar2->second).max_out_loss;
    uStack_a8._0_4_ = (ppVar2->first).summary_id;
    uStack_a8._4_4_ = (ppVar2->first).period_no;
    x.first._0_8_ = *(undefined8 *)&(ppVar2->first).sidx;
    this_01 = std::
              map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
              ::operator[]((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                            *)&__range1,(key_type *)&uStack_a8);
    plVar3 = (long *)((long)&x.first.period_no + CONCAT44(in_register_0000000c,epcalc));
    local_e0 = (code *)GetOutLoss;
    if ((GetOutLoss & 1) != 0) {
      local_e0 = *(code **)(*plVar3 + (GetOutLoss - 1));
    }
    local_b8[0] = (value_type_conflict2)(*local_e0)(plVar3);
    std::vector<float,_std::allocator<float>_>::push_back(this_01,local_b8);
    std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator++(&__end1);
  }
  WriteExceedanceProbabilityTable
            (this,fileIDs,
             (map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
              *)&__range1,(double)this->totalperiods_,
             items._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
             (int)items._M_t._M_impl.super__Rb_tree_header._M_node_count,in_stack_00000008,1);
  std::
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  ::~map((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
          *)&__range1);
  return;
}

Assistant:

void aggreports::MeanDamageRatio(const std::vector<int> &fileIDs,
				 OASIS_FLOAT (OutLosses::*GetOutLoss)(),
				 const int epcalc, const int eptype,
				 const int eptype_tvar) {

  std::map<int, lossvec> items;

  for (auto x : (*out_loss_)[MEANS]) {
    items[x.first.summary_id].push_back((x.second.*GetOutLoss)());
  }

  WriteExceedanceProbabilityTable(fileIDs, items, totalperiods_, epcalc,
				  eptype, eptype_tvar);

}